

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  int local_1c4;
  duration<long,_std::ratio<1L,_1L>_> local_1c0;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  value_type local_198;
  long local_178;
  size_t split;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sync_excludes;
  string local_138;
  undefined1 local_118 [8];
  string sync_excludes_str;
  string local_f0;
  undefined1 local_d0 [8];
  string filter_regex;
  string local_a8;
  undefined1 local_88 [8];
  string s3_bucket;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string local_path;
  
  local_path.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"LOCAL_PATH",&local_51);
  GetEnvironmentVariable((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"S3_BUCKET",(allocator *)(filter_regex.field_2._M_local_buf + 0xf))
  ;
  GetEnvironmentVariable((string *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)(filter_regex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,"FILTER_REGEX",
             (allocator *)(sync_excludes_str.field_2._M_local_buf + 0xf));
  GetEnvironmentVariable((string *)local_d0,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(sync_excludes_str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"SYNC_EXCLUDES",
             (allocator *)
             ((long)&sync_excludes._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  GetEnvironmentVariable((string *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sync_excludes._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&split);
  while( true ) {
    local_178 = std::__cxx11::string::find((char)local_118,0x7c);
    if (local_178 == -1) break;
    std::__cxx11::string::substr((ulong)&local_198,(ulong)local_118);
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&split,&local_198);
    local_1a8 = (_Base_ptr)pVar2.first._M_node;
    local_1a0 = pVar2.second;
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::erase((ulong)local_118,0);
  }
  pVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&split,(value_type *)local_118);
  local_1b8 = (_Base_ptr)pVar2.first._M_node;
  local_1b0 = pVar2.second;
  do {
    RunSyncer((string *)local_30,(string *)local_88,(string *)local_d0,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&split);
    poVar1 = Log();
    poVar1 = std::operator<<(poVar1,"Restarting in five seconds");
    std::ostream::operator<<((ostream *)poVar1,std::endl<char,std::char_traits<char>>);
    local_1c4 = 5;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_1c0,&local_1c4);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_1c0);
  } while( true );
}

Assistant:

int main() {
  // Obtain configuration from environment variables.
  std::string local_path = GetEnvironmentVariable("LOCAL_PATH");
  std::string s3_bucket = GetEnvironmentVariable("S3_BUCKET");
  std::string filter_regex = GetEnvironmentVariable("FILTER_REGEX");
  std::string sync_excludes_str = GetEnvironmentVariable("SYNC_EXCLUDES");

  // Convert single string of globs into a list by splitting on the '|',
  // for example: "*.jpg|*.mp3" -> {"*.jpg", "*.mp3"}.
  std::set<std::string> sync_excludes;
  for (;;) {
    std::size_t split = sync_excludes_str.find('|');
    if (split != std::string::npos) {
      sync_excludes.insert(sync_excludes_str.substr(0, split));
      sync_excludes_str.erase(0, split + 1);
    } else {
      sync_excludes.insert(sync_excludes_str);
      break;
    }
  }

  // Keep on running indefinitely, restarting if an error occurred. Put a pause
  // of a couple of seconds in between, so that we never perform any actions in
  // a tight loop.
  for (;;) {
    RunSyncer(local_path, s3_bucket, filter_regex, sync_excludes);
    Log() << "Restarting in five seconds" << std::endl;
    std::this_thread::sleep_for(std::chrono::seconds(5));
  }
}